

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::blitTo
          (GLFrameBuffer *this,FrameBuffer *targetIn)

{
  long lVar1;
  string local_38;
  
  if (targetIn != (FrameBuffer *)0x0) {
    lVar1 = __dynamic_cast(targetIn,&FrameBuffer::typeinfo,&typeinfo,0);
    if (lVar1 != 0) goto LAB_002809d9;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"tried to blitTo() non-GL framebuffer","");
  exception(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  lVar1 = 0;
LAB_002809d9:
  (*(this->super_FrameBuffer)._vptr_FrameBuffer[3])(this);
  (*glad_glBindFramebuffer)(0x8ca9,*(GLuint *)(lVar1 + 0xa8));
  (*glad_glBlitFramebuffer)
            (0,0,(this->super_FrameBuffer).sizeX,(this->super_FrameBuffer).sizeY,0,0,
             *(GLint *)(lVar1 + 0x1c),*(GLint *)(lVar1 + 0x20),0x4000,0x2601);
  checkGLError(true);
  return;
}

Assistant:

void GLFrameBuffer::blitTo(FrameBuffer* targetIn) {

  // it _better_ be a GL buffer
  GLFrameBuffer* target = dynamic_cast<GLFrameBuffer*>(targetIn);
  if (!target) exception("tried to blitTo() non-GL framebuffer");

  // target->bindForRendering();
  bindForRendering();
  glBindFramebuffer(GL_DRAW_FRAMEBUFFER, target->getHandle());

  glBlitFramebuffer(0, 0, getSizeX(), getSizeY(), 0, 0, target->getSizeX(), target->getSizeY(), GL_COLOR_BUFFER_BIT,
                    GL_LINEAR);
  checkGLError();
}